

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  int iVar1;
  uint uVar2;
  ConstantID const_id;
  uint32_t id;
  uint uVar3;
  TypeID type_id;
  uint32_t *puVar4;
  uint *puVar5;
  bool bVar6;
  CompilerGLSL *pCVar7;
  bool bVar8;
  bool bVar9;
  uint32_t uVar10;
  BaseType BVar11;
  SPIRType *type;
  SPIRType *pSVar12;
  mapped_type *initializers;
  CompilerError *pCVar13;
  SPIRConstant *this_00;
  char (*in_R9) [2];
  char *pcVar14;
  ConstantID const_id_00;
  Op opcode;
  ulong uVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  TypeID local_258;
  BaseType input_type;
  CompilerGLSL *local_248;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> new_init;
  string right_arg;
  string op;
  string local_1c8;
  Constant local_1a8;
  ParsedIR *local_1a0;
  SPIRConstant tmp_const;
  
  type = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,(cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  bVar8 = is_legacy(this);
  iVar1 = *(int *)&(cop->super_IVariant).field_0xc;
  if ((bVar8) &&
     (((iVar1 - 0x6dU < 0x40 && ((0x8000040012000019U >> ((ulong)(iVar1 - 0x6dU) & 0x3f) & 1) != 0))
      || ((iVar1 - 0xaeU < 0x15 && ((0x100015U >> (iVar1 - 0xaeU & 0x1f) & 1) != 0)))))) {
    pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar13,"Unsigned integers are not supported on legacy targets.");
    goto LAB_0012fd05;
  }
  pcVar14 = "!=";
  local_248 = this;
  switch(iVar1) {
  case 0x7e:
    goto LAB_0012f63a;
  case 0x7f:
  case 0x81:
  case 0x83:
  case 0x85:
  case 0x88:
  case 0x8c:
  case 0x8d:
  case 0x8e:
  case 0x8f:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case 0x96:
  case 0x97:
  case 0x98:
  case 0x99:
  case 0x9a:
  case 0x9b:
  case 0x9c:
  case 0x9d:
  case 0x9e:
  case 0x9f:
  case 0xa0:
  case 0xa1:
  case 0xa2:
  case 0xa3:
  case 0xb4:
  case 0xb5:
  case 0xb6:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case 0xbb:
  case 0xbc:
  case 0xbd:
  case 0xbe:
  case 0xbf:
  case 0xc0:
  case 0xc1:
switchD_0012f317_caseD_7f:
    pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(pCVar13,"Unimplemented spec constant op.");
LAB_0012fd05:
    __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    break;
  case 0x82:
    break;
  case 0x84:
    break;
  case 0x86:
  case 0x87:
    break;
  case 0x89:
  case 0x8b:
    break;
  case 0x8a:
    puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    uVar10 = *puVar4;
    id = puVar4[1];
    to_enclosed_expression_abi_cxx11_((string *)&tmp_const,this,uVar10,true);
    to_enclosed_expression_abi_cxx11_((string *)&new_init,this,id,true);
    to_enclosed_expression_abi_cxx11_(&right_arg,this,uVar10,true);
    to_enclosed_expression_abi_cxx11_(&local_1c8,this,id,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2836d7,
               (char (*) [4])&new_init,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x297bf3,
               (char (*) [4])0x29618e,(char (*) [2])&right_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2948a4,
               (char (*) [4])&local_1c8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
               (char (*) [2])in_stack_fffffffffffffd98);
    ::std::__cxx11::string::~string((string *)&local_1c8);
    ::std::__cxx11::string::~string((string *)&right_arg);
    ::std::__cxx11::string::~string((string *)&new_init);
    goto LAB_0012fa1c;
  case 0xa4:
  case 0xaa:
    break;
  case 0xa5:
  case 0xab:
    break;
  case 0xa6:
    break;
  case 0xa7:
    break;
  case 0xa8:
    goto LAB_0012f63a;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10,"/","<","<=",">");
      CompilerError::CompilerError(pCVar13,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_0012fd05;
    }
    puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar5;
    bVar8 = to_trivial_mix_op(this,type,&op,puVar5[2],puVar5[1],*puVar5);
    if (!bVar8) {
      puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_(__return_storage_ptr__,this,type,*puVar4,puVar4[1],puVar4[2])
      ;
      goto LAB_0012fa29;
    }
LAB_0012f45f:
    opcode = *(Op *)&(cop->super_IVariant).field_0xc;
    bVar8 = false;
    bVar6 = false;
    uVar10 = 0;
    pcVar14 = *in_R9;
    bVar9 = false;
    if (opcode - OpUConvert < 2) goto LAB_0012f689;
    goto LAB_0012f69e;
  case 0xac:
  case 0xad:
    break;
  case 0xae:
  case 0xaf:
    break;
  case 0xb0:
  case 0xb1:
    break;
  case 0xb2:
  case 0xb3:
    break;
  case 0xc2:
  case 0xc3:
    break;
  case 0xc4:
    break;
  case 0xc5:
    break;
  case 0xc6:
    break;
  case 199:
    break;
  case 200:
LAB_0012f63a:
    ::std::__cxx11::string::assign((char *)&op);
    bVar6 = true;
    bVar9 = false;
    goto LAB_0012f689;
  default:
    if (iVar1 - 0x71U < 3) {
      type_to_glsl_constructor_abi_cxx11_((string *)&tmp_const,this,type);
      ::std::__cxx11::string::operator=((string *)&op,(string *)&tmp_const);
      ::std::__cxx11::string::~string((string *)&tmp_const);
      goto LAB_0012f45f;
    }
    if (iVar1 != 0x4f) {
      if (iVar1 == 0x51) {
        puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
        access_chain_internal_abi_cxx11_
                  (__return_storage_ptr__,this,*puVar4,puVar4 + 1,
                   (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                   (AccessChainMeta *)0x0);
        goto LAB_0012fa29;
      }
      if (iVar1 == 0x52) {
        local_1a8 = (Constant)__return_storage_ptr__;
        get_composite_constant_ids
                  (&new_init,this,(ConstantID)(cop->arguments).super_VectorView<unsigned_int>.ptr[1]
                  );
        local_258.id = (cop->basetype).id;
        local_1a0 = &(this->super_Compiler).ir;
        const_id_00.id = (cop->super_IVariant).self.id;
        for (uVar15 = 2; uVar15 < (cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1;
            uVar15 = (ulong)((int)uVar15 + 1)) {
          uVar10 = ParsedIR::increase_bound_by(local_1a0,1);
          pCVar7 = local_248;
          uVar2 = (cop->arguments).super_VectorView<unsigned_int>.ptr[uVar15];
          const_id.id = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                        [uVar2].id;
          new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[uVar2].id =
               uVar10;
          set_composite_constant(local_248,const_id_00,local_258,&new_init);
          get_composite_constant_ids
                    ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const,
                     pCVar7,const_id);
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
                    (&new_init,
                     (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const);
          SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::~SmallVector
                    ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const);
          local_258 = get_composite_member_type
                                (pCVar7,local_258,
                                 (cop->arguments).super_VectorView<unsigned_int>.ptr[uVar15]);
          const_id_00.id = uVar10;
        }
        puVar5 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
        new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[puVar5[uVar15]].
        id = *puVar5;
        set_composite_constant(local_248,const_id_00,local_258,&new_init);
        SPIRConstant::SPIRConstant(&tmp_const,(cop->basetype).id);
        __return_storage_ptr__ = (string *)local_1a8;
        pCVar7 = local_248;
        type_id.id = (cop->basetype).id;
        right_arg._M_dataplus._M_p._0_4_ = (cop->super_IVariant).self.id;
        initializers = ::std::__detail::
                       _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                     *)&local_248->const_composite_insert_ids,(key_type *)&right_arg
                                   );
        fill_composite_constant(pCVar7,&tmp_const,type_id,initializers);
        constant_expression_abi_cxx11_(__return_storage_ptr__,pCVar7,&tmp_const,false,false);
        SPIRConstant::~SPIRConstant(&tmp_const);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::~SmallVector(&new_init);
        goto LAB_0012fa29;
      }
      goto switchD_0012f317_caseD_7f;
    }
    type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type);
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    pSVar12 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    uVar2 = pSVar12->vecsize;
    to_enclosed_expression_abi_cxx11_
              ((string *)&new_init,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    to_enclosed_expression_abi_cxx11_
              (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
    uVar15 = 2;
    while (uVar15 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
      uVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr[uVar15];
      if ((ulong)uVar3 == 0xffffffff) {
        SPIRConstant::SPIRConstant(&tmp_const);
        tmp_const.super_IVariant._12_4_ = (type->parent_type).id;
        if (tmp_const.super_IVariant._12_4_ == 0) {
          __assert_fail("type.parent_type != ID(0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                        ,0x1676,
                        "virtual string spirv_cross::CompilerGLSL::constant_op_expression(const SPIRConstantOp &)"
                       );
        }
        constant_expression_abi_cxx11_(&local_1c8,local_248,&tmp_const,false,false);
        ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        ::std::__cxx11::string::~string((string *)&local_1c8);
        SPIRConstant::~SPIRConstant(&tmp_const);
      }
      else {
        if (uVar3 < uVar2) {
          ::std::operator+(&local_1c8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &new_init,".");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tmp_const,&local_1c8,"xyzw"[uVar3]);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        else {
          ::std::operator+(&local_1c8,&right_arg,".");
          ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &tmp_const,&local_1c8,"xyzw"[uVar3 - uVar2]);
          ::std::__cxx11::string::append((string *)__return_storage_ptr__);
        }
        ::std::__cxx11::string::~string((string *)&tmp_const);
        ::std::__cxx11::string::~string((string *)&local_1c8);
      }
      uVar15 = uVar15 + 1;
      if (uVar15 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
        ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
    }
    ::std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_0012f97d;
  }
  ::std::__cxx11::string::assign((char *)&op);
  bVar6 = false;
  bVar9 = true;
LAB_0012f689:
  bVar8 = bVar9;
  pSVar12 = Compiler::expression_type
                      (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
  uVar10 = pSVar12->width;
  opcode = *(Op *)&(cop->super_IVariant).field_0xc;
  in_R9 = (char (*) [2])pcVar14;
LAB_0012f69e:
  bVar9 = opcode_is_sign_invariant(opcode);
  uVar2 = opcode - OpIEqual;
  if (uVar2 < 0x1a) {
    if ((0x1000154U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_0012f6f3_caseD_86;
    if ((0x20002a8U >> (uVar2 & 0x1f) & 1) != 0) goto switchD_0012f6f3_caseD_87;
    if ((3U >> (uVar2 & 0x1f) & 1) == 0) goto code_r0x0012f6e5;
    BVar11 = to_signed_basetype(uVar10);
  }
  else {
code_r0x0012f6e5:
    switch(opcode) {
    case OpSDiv:
    case OpSMod:
switchD_0012f6f3_caseD_87:
      BVar11 = to_signed_basetype(uVar10);
      break;
    case OpFDiv:
    case OpSRem:
switchD_0012f6f3_caseD_88:
      BVar11 = type->basetype;
      break;
    default:
      if (opcode != OpUConvert) {
        if ((opcode != OpSConvert) && (opcode != OpSNegate)) goto switchD_0012f6f3_caseD_88;
        goto switchD_0012f6f3_caseD_87;
      }
    case OpUDiv:
    case OpUMod:
switchD_0012f6f3_caseD_86:
      BVar11 = to_unsigned_basetype(uVar10);
    }
  }
  pCVar7 = local_248;
  input_type = BVar11;
  if (bVar8) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar13,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_0012fda8;
    }
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
         (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity;
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size = 0;
    new_init.buffer_capacity._0_1_ = 0;
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    binary_op_bitcast_helper
              ((SPIRType *)&tmp_const,local_248,(string *)&new_init,&right_arg,&input_type,*puVar4,
               puVar4[1],bVar9);
    if (type->basetype == Boolean || type->basetype == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x29618e,(char (*) [2])&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                 (char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                 (char (*) [2])in_stack_fffffffffffffd98);
    }
    else {
      tmp_const.m.c[0].r[0].u32 = input_type;
      (*(pCVar7->super_Compiler)._vptr_Compiler[0x3c])(__return_storage_ptr__,pCVar7);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_1c8,(spirv_cross *)&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27f106,
                 (char (*) [2])&right_arg,in_stack_fffffffffffffd98);
      ::std::__cxx11::string::append((string *)__return_storage_ptr__);
      ::std::__cxx11::string::~string((string *)&local_1c8);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    SPIRType::~SPIRType((SPIRType *)&tmp_const);
LAB_0012f97d:
    ::std::__cxx11::string::~string((string *)&right_arg);
    this_00 = (SPIRConstant *)&new_init;
  }
  else {
    if (bVar6) {
      if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar13,"Not enough arguments to OpSpecConstantOp.");
        goto LAB_0012fda8;
      }
      bitcast_glsl_abi_cxx11_
                ((string *)&tmp_const,local_248,type,
                 *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x29618e,(char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_const,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,in_R9
                );
    }
    else if (*(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2) {
      if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar13,"Not enough arguments to OpSpecConstantOp.");
LAB_0012fda8:
        __cxa_throw(pCVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
      }
      pSVar12 = Compiler::expression_type
                          (&local_248->super_Compiler,
                           *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      if ((pSVar12->width < type->width) && (BVar11 != pSVar12->basetype)) {
        SPIRType::SPIRType((SPIRType *)&tmp_const,pSVar12);
        tmp_const.m.c[0].r[0].u32 = BVar11;
        bitcast_glsl_abi_cxx11_
                  ((string *)&new_init,pCVar7,(SPIRType *)&tmp_const,
                   *(cop->arguments).super_VectorView<unsigned_int>.ptr);
        join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                  (__return_storage_ptr__,(spirv_cross *)&op,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
                   (char (*) [2])&new_init,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,
                   in_R9);
        ::std::__cxx11::string::~string((string *)&new_init);
        SPIRType::~SPIRType((SPIRType *)&tmp_const);
        goto LAB_0012fa29;
      }
      to_expression_abi_cxx11_
                ((string *)&tmp_const,pCVar7,*(cop->arguments).super_VectorView<unsigned_int>.ptr,
                 true);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
                 (char (*) [2])&tmp_const,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,in_R9
                );
    }
    else {
      if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
        pCVar13 = (CompilerError *)__cxa_allocate_exception(0x10);
        CompilerError::CompilerError(pCVar13,"Not enough arguments to OpSpecConstantOp.");
        goto LAB_0012fda8;
      }
      to_expression_abi_cxx11_
                ((string *)&tmp_const,local_248,*(cop->arguments).super_VectorView<unsigned_int>.ptr
                 ,true);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x29618e,
                 (char (*) [2])&tmp_const,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x27e75d,in_R9
                );
    }
LAB_0012fa1c:
    this_00 = &tmp_const;
  }
  ::std::__cxx11::string::~string((string *)this_00);
LAB_0012fa29:
  ::std::__cxx11::string::~string((string *)&op);
  return (string *)((Constant)__return_storage_ptr__).u64;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index == 0xFFFFFFFF)
			{
				SPIRConstant c;
				c.constant_type = type.parent_type;
				assert(type.parent_type != ID(0));
				expr += constant_expression(c);
			}
			else if (index >= left_components)
			{
				expr += right_arg + "." + "xyzw"[index - left_components];
			}
			else
			{
				expr += left_arg + "." + "xyzw"[index];
			}

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
	{
		SmallVector<ConstantID> new_init = get_composite_constant_ids(cop.arguments[1]);
		uint32_t idx;
		uint32_t target_id = cop.self;
		uint32_t target_type_id = cop.basetype;
		// We have to drill down to the part we want to modify, and create new
		// constants for each containing part.
		for (idx = 2; idx < cop.arguments.size() - 1; ++idx)
		{
			uint32_t new_const = ir.increase_bound_by(1);
			uint32_t old_const = new_init[cop.arguments[idx]];
			new_init[cop.arguments[idx]] = new_const;
			set_composite_constant(target_id, target_type_id, new_init);
			new_init = get_composite_constant_ids(old_const);
			target_id = new_const;
			target_type_id = get_composite_member_type(target_type_id, cop.arguments[idx]);
		}
		// Now replace the initializer with the one from this instruction.
		new_init[cop.arguments[idx]] = cop.arguments[0];
		set_composite_constant(target_id, target_type_id, new_init);
		SPIRConstant tmp_const(cop.basetype);
		fill_composite_constant(tmp_const, cop.basetype, const_composite_insert_ids[cop.self]);
		return constant_expression(tmp_const);
	}

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}